

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.cpp
# Opt level: O3

Event * ftxui::Event::Mouse(Event *__return_storage_ptr__,string *input,Mouse mouse)

{
  __return_storage_ptr__->type_ = Unknown;
  (__return_storage_ptr__->input_)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->input_).field_2;
  (__return_storage_ptr__->input_)._M_string_length = 0;
  (__return_storage_ptr__->input_).field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->screen_ = (ScreenInteractive *)0x0;
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->input_,(string *)input);
  __return_storage_ptr__->type_ = Mouse;
  *(int *)&__return_storage_ptr__->field_1 = mouse.button;
  *(Motion *)((long)&__return_storage_ptr__->field_1 + 4) = mouse.motion;
  *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 8) = mouse._8_8_;
  (__return_storage_ptr__->field_1).mouse_.y = mouse.y;
  return __return_storage_ptr__;
}

Assistant:

Event Event::Mouse(std::string input, struct Mouse mouse) {
  Event event;
  event.input_ = std::move(input);
  event.type_ = Type::Mouse;
  event.mouse_ = mouse;
  return event;
}